

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O2

string * google::protobuf::CEscape(string *__return_storage_ptr__,string *src)

{
  string *in_RCX;
  StringPiece src_00;
  StringPiece local_28;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  StringPiece::StringPiece<std::allocator<char>>(&local_28,src);
  src_00.length_ = (stringpiece_ssize_type)__return_storage_ptr__;
  src_00.ptr_ = (char *)local_28.length_;
  CEscapeAndAppend((protobuf *)local_28.ptr_,src_00,in_RCX);
  return __return_storage_ptr__;
}

Assistant:

string CEscape(const string& src) {
  string dest;
  CEscapeAndAppend(src, &dest);
  return dest;
}